

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall parser::parser(parser *this,size_t ring_size)

{
  _func_void_void_ptr *p_Var1;
  _func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *p_Var2;
  _func_void_void_ptr_io_buf_ptr *p_Var3;
  _func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *p_Var4;
  _func_void_void_ptr *p_Var5;
  _func_float_void_ptr *p_Var6;
  _func_bool_void_ptr *p_Var7;
  void *pvVar8;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  size_t in_stack_fffffffffffffed8;
  ptr_queue<example> *in_stack_fffffffffffffee0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  VW::object_pool<example,_example_initializer>::object_pool
            ((object_pool<example,_example_initializer> *)(in_RDI + 8),in_RSI,8);
  VW::ptr_queue<example>::ptr_queue(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  in_RDI[0x3d] = 0;
  in_RDI[0x41] = 0;
  *(undefined1 *)(in_RDI + 0x42) = 0;
  *(undefined1 *)((long)in_RDI + 0x211) = 0;
  *(undefined1 *)((long)in_RDI + 0x212) = 0;
  in_RDI[0x43] = in_RSI;
  in_RDI[0x44] = 0;
  in_RDI[0x45] = 0;
  *(undefined4 *)(in_RDI + 0x46) = 0;
  *(undefined1 *)((long)in_RDI + 0x234) = 0;
  std::mutex::mutex((mutex *)0x142841);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x4c));
  *(undefined1 *)(in_RDI + 0x52) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)((long)in_RDI + 0x304) = 0;
  *(undefined4 *)(in_RDI + 0x61) = 0;
  *(undefined1 *)(in_RDI + 0x6f) = 0;
  *(undefined1 *)((long)in_RDI + 0x379) = 0;
  std::shared_ptr<void>::shared_ptr((shared_ptr<void> *)0x1428a0);
  pvVar8 = operator_new(0xa8);
  io_buf::io_buf((io_buf *)0x1428bb);
  in_RDI[0x3d] = pvVar8;
  pvVar8 = operator_new(0xa8);
  io_buf::io_buf((io_buf *)0x1428e9);
  in_RDI[0x41] = pvVar8;
  in_RDI[0x6e] = simple_label.label_size;
  p_Var7 = simple_label.test_label;
  p_Var6 = simple_label.get_weight;
  p_Var5 = simple_label.delete_label;
  p_Var4 = simple_label.read_cached_label;
  p_Var3 = simple_label.cache_label;
  p_Var2 = simple_label.parse_label;
  p_Var1 = simple_label.default_label;
  in_RDI[0x6c] = simple_label.copy_label;
  in_RDI[0x6d] = p_Var7;
  in_RDI[0x6a] = p_Var5;
  in_RDI[0x6b] = p_Var6;
  in_RDI[0x68] = p_Var3;
  in_RDI[0x69] = p_Var4;
  in_RDI[0x66] = p_Var1;
  in_RDI[0x67] = p_Var2;
  v_init<substring>();
  in_RDI[2] = local_38;
  in_RDI[3] = uStack_30;
  *in_RDI = local_48;
  in_RDI[1] = uStack_40;
  v_init<substring>();
  in_RDI[6] = local_58;
  in_RDI[7] = uStack_50;
  in_RDI[4] = local_68;
  in_RDI[5] = uStack_60;
  v_init<substring>();
  in_RDI[0x62] = local_88;
  in_RDI[99] = local_80;
  in_RDI[100] = local_78;
  in_RDI[0x65] = local_70;
  v_init<unsigned_long>();
  in_RDI[0x53] = local_a8;
  in_RDI[0x54] = local_a0;
  in_RDI[0x55] = local_98;
  in_RDI[0x56] = local_90;
  v_init<unsigned_long>();
  in_RDI[0x57] = local_c8;
  in_RDI[0x58] = local_c0;
  in_RDI[0x59] = local_b8;
  in_RDI[0x5a] = local_b0;
  v_init<unsigned_long>();
  in_RDI[0x5b] = local_e8;
  in_RDI[0x5c] = local_e0;
  in_RDI[0x5d] = local_d8;
  in_RDI[0x5e] = local_d0;
  return;
}

Assistant:

parser(size_t ring_size)
      : example_pool{ring_size}, ready_parsed_examples{ring_size}, ring_size{ring_size}
  {
    this->input = new io_buf{};
    this->output = new io_buf{};
    this->lp = simple_label;

    // Free parser must still be used for the following fields.
    this->words = v_init<substring>();
    this->name = v_init<substring>();
    this->parse_name = v_init<substring>();
    this->gram_mask = v_init<size_t>();
    this->ids = v_init<size_t>();
    this->counts = v_init<size_t>();
  }